

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::ParseAddtlInfo_SnapRegexInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  RegexFlags RVar1;
  uint32 uVar2;
  SnapRegexInfo *addtlInfo;
  TTDVar pvVar3;
  FileReader *reader_00;
  SnapRegexInfo *regexInfo;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  SnapObject *snpObject_local;
  
  addtlInfo = SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapRegexInfo>(alloc);
  FileReader::ReadString<TTD::SlabAllocatorBase<0>>
            (reader,stringVal,alloc,&addtlInfo->RegexStr,true);
  RVar1 = FileReader::ReadTag<UnifiedRegex::RegexFlags>(reader,attributeFlags,true);
  addtlInfo->Flags = RVar1;
  uVar2 = FileReader::ReadUInt32(reader,u32Val,true);
  addtlInfo->LastIndexOrFlag = uVar2;
  (*reader->_vptr_FileReader[3])(reader,0x14,1);
  pvVar3 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_00);
  addtlInfo->LastIndexVar = pvVar3;
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapRegexInfo*,(TTD::NSSnapObjects::SnapObjectType)17>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapRegexInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapRegexInfo* regexInfo = alloc.SlabAllocateStruct<SnapRegexInfo>();

            reader->ReadString(NSTokens::Key::stringVal, alloc, regexInfo->RegexStr, true);

            regexInfo->Flags = reader->ReadTag<UnifiedRegex::RegexFlags>(NSTokens::Key::attributeFlags, true);
            regexInfo->LastIndexOrFlag = reader->ReadUInt32(NSTokens::Key::u32Val, true);

            reader->ReadKey(NSTokens::Key::ttdVarTag, true);
            regexInfo->LastIndexVar = NSSnapValues::ParseTTDVar(false, reader);

            SnapObjectSetAddtlInfoAs<SnapRegexInfo*, SnapObjectType::SnapRegexObject>(snpObject, regexInfo);
        }